

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::set_stringvalue
          (CustomLayerParams_CustomLayerParamValue *this,string *value)

{
  if (this->_oneof_case_[0] != 0x14) {
    clear_value(this);
    this->_oneof_case_[0] = 0x14;
    (this->value_).doublevalue_ =
         (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&(this->value_).stringvalue_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,value);
  return;
}

Assistant:

inline void CustomLayerParams_CustomLayerParamValue::set_stringvalue(const ::std::string& value) {
  // @@protoc_insertion_point(field_set:CoreML.Specification.CustomLayerParams.CustomLayerParamValue.stringValue)
  if (!has_stringvalue()) {
    clear_value();
    set_has_stringvalue();
    value_.stringvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  value_.stringvalue_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), value);
  // @@protoc_insertion_point(field_set:CoreML.Specification.CustomLayerParams.CustomLayerParamValue.stringValue)
}